

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<32,_2048>::~ObjectBlockPool(ObjectBlockPool<32,_2048> *this)

{
  Reset(this);
  FastVector<SmallBlock<32>_*,_false,_false>::~FastVector(&this->objectsToFree);
  FastVector<SmallBlock<32>_*,_false,_false>::~FastVector(&this->objectsToFinalize);
  FastVector<LargeBlock<32,_2048>_*,_false,_false>::~FastVector(&this->sortedPages);
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}